

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

Point2f pbrt::RejectionSampleDisk(RNG *rng)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  do {
    auVar4._0_4_ = RNG::Uniform<float>(rng);
    auVar4._4_60_ = extraout_var;
    auVar2 = vfmadd213ss_fma(auVar4._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                             SUB6416(ZEXT464(0x3f800000),0));
    auVar5._0_4_ = RNG::Uniform<float>(rng);
    auVar5._4_60_ = extraout_var_00;
    auVar1 = vfmadd132ss_fma(auVar5._0_16_,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ * auVar1._0_4_)),auVar2,auVar2);
  } while (1.0 < auVar3._0_4_);
  auVar1 = vinsertps_avx(auVar2,auVar1,0x10);
  return (Point2f)auVar1._0_8_;
}

Assistant:

Point2f RejectionSampleDisk(RNG &rng) {
    Point2f p;
    do {
        p.x = 1 - 2 * rng.Uniform<Float>();
        p.y = 1 - 2 * rng.Uniform<Float>();
    } while (p.x * p.x + p.y * p.y > 1);
    return p;
}